

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latex.hpp
# Opt level: O3

bool __thiscall
viennamath::rt_latex_function_symbol_processor<viennamath::rt_expression_interface<double>_>::
customize(rt_latex_function_symbol_processor<viennamath::rt_expression_interface<double>_> *this,
         rt_expression_interface<double> *ptr,string *str)

{
  long lVar1;
  mapped_type *pmVar2;
  bool bVar3;
  key_type local_28;
  
  if (ptr == (rt_expression_interface<double> *)0x0) {
    bVar3 = false;
  }
  else {
    bVar3 = false;
    lVar1 = __dynamic_cast(ptr,&rt_expression_interface<double>::typeinfo,
                           &rt_function_symbol<viennamath::rt_expression_interface<double>>::
                            typeinfo,0);
    if (lVar1 != 0) {
      local_28.first = *(unsigned_long *)(lVar1 + 8);
      local_28.second = *(unsigned_long *)(lVar1 + 0x10);
      pmVar2 = std::
               map<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->function_symbol_strings_,&local_28);
      std::__cxx11::string::_M_assign((string *)pmVar2);
      bVar3 = true;
    }
  }
  return bVar3;
}

Assistant:

bool customize(InterfaceType const * ptr, std::string const & str)
      {
        if (dynamic_cast< const FuncSymbol * >(ptr) != NULL)
        {
          const FuncSymbol * temp = dynamic_cast< const FuncSymbol * >(ptr);
          KeyType key(temp->id(), temp->tag_id());
          function_symbol_strings_[key] = str;
          return true;
        }
        return false;
      }